

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O1

char * __thiscall Memory::JitArenaAllocator::AllocZero(JitArenaAllocator *this,size_t nbytes)

{
  char *__s;
  
  __s = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                  ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,nbytes
                  );
  memset(__s,0,nbytes);
  memset(__s + nbytes,0,(nbytes + 0xf & 0xfffffffffffffff0) - nbytes);
  return __s;
}

Assistant:

char * AllocZero(DECLSPEC_GUARD_OVERFLOW size_t nbytes)
    {
        return ArenaAllocator::AllocZero(nbytes);
    }